

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O3

void __thiscall
xemmai::t_engine::f_epoch_increment
          (t_engine *this,t_object ***a_p0,t_object ***a_p1,t_object **a_q1,t_object ***a_decrements
          )

{
  t_object **pptVar1;
  t_object *ptVar2;
  t_object *ptVar3;
  
  if (*a_p1 < a_q1) {
    do {
      pptVar1 = *a_p0;
      *a_p0 = pptVar1 + 1;
      ptVar3 = *pptVar1;
      ptVar2 = **a_p1;
      if (ptVar3 != ptVar2) {
        if ((((ulong)ptVar3 & 0x7f) == 0) &&
           (ptVar3 = t_heap<xemmai::t_object>::f_find(&this->v_object__heap,ptVar3),
           ptVar3 != (t_object *)0x0)) {
          if (ptVar3->v_type == (t_type *)0x0) {
            ptVar3 = (t_object *)0x0;
          }
        }
        else {
          ptVar3 = (t_object *)0x0;
        }
        if (ptVar3 != ptVar2) {
          if (ptVar3 != (t_object *)0x0) {
            ptVar3->v_count = ptVar3->v_count + 1;
            ptVar3->v_color = c_color__BLACK;
          }
          if (ptVar2 != (t_object *)0x0) {
            pptVar1 = *a_decrements;
            *a_decrements = pptVar1 + 1;
            *pptVar1 = ptVar2;
          }
          **a_p1 = ptVar3;
        }
      }
      pptVar1 = *a_p1;
      *a_p1 = pptVar1 + 1;
    } while (pptVar1 + 1 < a_q1);
  }
  return;
}

Assistant:

void f_epoch_increment(t_object**& a_p0, t_object**& a_p1, t_object** a_q1, t_object**& a_decrements)
	{
		for (; a_p1 < a_q1; ++a_p1) {
			auto p = *a_p0++;
			auto q = *a_p1;
			if (p == q) continue;
			p = f_object__find(p);
			if (p == q) continue;
			if (p) p->f_increment();
			if (q) *a_decrements++ = q;
			*a_p1 = p;
		}
	}